

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O1

void stable_grail_merge_left(int **arr,int L1,int L2,int M)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  int **ppiVar4;
  int iVar5;
  
  if (L2 < 1) {
    iVar2 = 0;
  }
  else {
    ppiVar4 = arr + M;
    iVar2 = 0;
    iVar5 = L1;
    do {
      if (iVar2 == L1) {
LAB_00117537:
        piVar1 = *ppiVar4;
        *ppiVar4 = arr[iVar5];
        arr[iVar5] = piVar1;
        iVar5 = iVar5 + 1;
      }
      else {
        if (*arr[iVar5] < *arr[iVar2]) goto LAB_00117537;
        piVar1 = *ppiVar4;
        *ppiVar4 = arr[iVar2];
        arr[iVar2] = piVar1;
        iVar2 = iVar2 + 1;
      }
      ppiVar4 = ppiVar4 + 1;
      M = M + 1;
    } while (iVar5 < L2 + L1);
  }
  if ((M != iVar2) && (L1 != iVar2)) {
    lVar3 = 0;
    do {
      piVar1 = arr[M + lVar3];
      arr[M + lVar3] = arr[iVar2 + lVar3];
      arr[iVar2 + lVar3] = piVar1;
      lVar3 = lVar3 + 1;
    } while (L1 - iVar2 != (int)lVar3);
  }
  return;
}

Assistant:

static void GRAIL_MERGE_LEFT(SORT_TYPE *arr, int L1, int L2, int M) {
  int p0 = 0, p1 = L1;
  L2 += L1;

  while (p1 < L2) {
    if (p0 == L1 || SORT_CMP_A(arr + p0, arr + p1) > 0) {
      GRAIL_SWAP1(arr + (M++), arr + (p1++));
    } else {
      GRAIL_SWAP1(arr + (M++), arr + (p0++));
    }
  }

  if (M != p0) {
    GRAIL_SWAP_N(arr + M, arr + p0, L1 - p0);
  }
}